

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O0

XMLReader * __thiscall
xercesc_4_0::ReaderMgr::getLastExtEntity(ReaderMgr *this,XMLEntityDecl **itsEntity)

{
  bool bVar1;
  XMLSize_t index_00;
  ReaderData *pRVar2;
  XMLEntityDecl *local_40;
  XMLSize_t index;
  XMLEntityDecl *curEntity;
  XMLReader *theReader;
  XMLEntityDecl **itsEntity_local;
  ReaderMgr *this_local;
  
  curEntity = (XMLEntityDecl *)this->fCurReader;
  if (this->fCurReaderData == (ReaderData *)0x0) {
    local_40 = (XMLEntityDecl *)0x0;
  }
  else {
    local_40 = ReaderData::getEntity(this->fCurReaderData);
  }
  index = (XMLSize_t)local_40;
  if ((local_40 != (XMLEntityDecl *)0x0) && (bVar1 = XMLEntityDecl::isExternal(local_40), !bVar1)) {
    index_00 = RefStackOf<xercesc_4_0::ReaderMgr::ReaderData>::size(this->fReaderStack);
    do {
      if (index_00 == 0) goto LAB_00364fe5;
      index_00 = index_00 - 1;
      pRVar2 = RefStackOf<xercesc_4_0::ReaderMgr::ReaderData>::elementAt
                         (this->fReaderStack,index_00);
      index = (XMLSize_t)ReaderData::getEntity(pRVar2);
      if ((XMLEntityDecl *)index == (XMLEntityDecl *)0x0) {
        pRVar2 = RefStackOf<xercesc_4_0::ReaderMgr::ReaderData>::elementAt
                           (this->fReaderStack,index_00);
        curEntity = (XMLEntityDecl *)ReaderData::getReader(pRVar2);
        goto LAB_00364fe5;
      }
      bVar1 = XMLEntityDecl::isExternal((XMLEntityDecl *)index);
    } while (!bVar1);
    pRVar2 = RefStackOf<xercesc_4_0::ReaderMgr::ReaderData>::elementAt(this->fReaderStack,index_00);
    curEntity = (XMLEntityDecl *)ReaderData::getReader(pRVar2);
  }
LAB_00364fe5:
  *itsEntity = (XMLEntityDecl *)index;
  return (XMLReader *)curEntity;
}

Assistant:

const XMLReader*
ReaderMgr::getLastExtEntity(const XMLEntityDecl*& itsEntity) const
{
    //
    //  Scan down the reader stack until we find a reader for an entity that
    //  is external. First check that there is anything in the stack at all,
    //  in which case the current reader is the main file and that's the one
    //  that we want.
    //
    const XMLReader* theReader = fCurReader;

    //
    //  If there is a current entity and it is not an external entity, then
    //  search the stack; else, keep the reader that we've got since its
    //  either an external entity reader or the main file reader.
    //
    const XMLEntityDecl* curEntity =
        fCurReaderData? fCurReaderData->getEntity() : 0;

    if (curEntity && !curEntity->isExternal())
    {
        XMLSize_t index = fReaderStack->size();
        if (index)
        {
            while (true)
            {
                // Move down to the previous element and get a pointer to it
                index--;
                curEntity = fReaderStack->elementAt(index)->getEntity();

                //
                //  If its null or its an external entity, then this reader
                //  is what we want, so break out with that one.
                //
                if (!curEntity)
                {
                    theReader = fReaderStack->elementAt(index)->getReader ();
                    break;
                }
                 else if (curEntity->isExternal())
                {
                    theReader = fReaderStack->elementAt(index)->getReader ();
                    break;
                }

                // We hit the end, so leave the main file reader as the one
                if (!index)
                    break;
            }
        }
    }

    // @@ It feels like we may end up with theReader being from the top of
    //    the stack (fCurReader) and itsEntity being from the bottom of the
    //    stack (if there are no null or external entities on the stack).
    //    Is it a bug?
    //
    itsEntity = curEntity;
    return theReader;
}